

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c
# Opt level: O3

sexp_conflict
sexp_file_lock_stub(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict arg0,
                   sexp_conflict arg1)

{
  sexp psVar1;
  int iVar2;
  uint uVar3;
  sexp_conflict psVar4;
  sexp_uint_t sVar5;
  
  if (((ulong)arg0 & 3) == 0) {
    if (2 < arg0->tag - 0x10) goto LAB_001035e4;
  }
  else if (((ulong)arg0 & 1) == 0) {
LAB_001035e4:
    psVar4 = (sexp_conflict)sexp_xtype_exception(ctx,self,"not a port or file descriptor");
    return psVar4;
  }
  if ((((ulong)arg1 & 1) == 0) && ((((ulong)arg1 & 2) != 0 || (arg1->tag != 0xc)))) {
    psVar4 = (sexp_conflict)sexp_type_exception(ctx,self,2,arg1);
    return psVar4;
  }
  if (((ulong)arg0 & 3) == 0) {
    if (arg0->tag - 0x10 < 2) {
      psVar1 = (arg0->value).type.getters;
      if (psVar1 == (sexp)0x0) {
        psVar1 = (arg0->value).type.slots;
        sVar5 = 0xffffffffffffffff;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x12)) {
          sVar5 = (psVar1->value).string.offset;
        }
      }
      else {
        uVar3 = fileno((FILE *)psVar1);
        sVar5 = (sexp_uint_t)uVar3;
      }
      goto LAB_00103612;
    }
    if (arg0->tag == 0x12) {
      sVar5 = (arg0->value).string.offset;
      goto LAB_00103612;
    }
  }
  sVar5 = (long)arg0 >> 1;
LAB_00103612:
  if (((ulong)arg1 & 1) == 0) {
    if ((((ulong)arg1 & 2) == 0) && (arg1->tag == 0xc)) {
      iVar2 = (int)(arg1->value).flonum_bits[0] * (int)(arg1->value).uvector.length;
    }
    else {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = (int)((long)arg1 >> 1);
  }
  iVar2 = flock(sVar5 & 0xffffffff,iVar2);
  return (sexp_conflict)((ulong)(iVar2 == 0) << 8 | 0x3e);
}

Assistant:

sexp sexp_file_lock_stub (sexp ctx, sexp self, sexp_sint_t n, sexp arg0, sexp arg1) {
  int err = 0;
  sexp res;
  if (! (sexp_portp(arg0) || sexp_filenop(arg0) || sexp_fixnump(arg0)))
    return sexp_xtype_exception(ctx, self, "not a port or file descriptor",arg0);
  if (! sexp_exact_integerp(arg1))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, arg1);
  err = flock((sexp_portp(arg0) ? sexp_port_fileno(arg0) : sexp_filenop(arg0) ? sexp_fileno_fd(arg0) : sexp_unbox_fixnum(arg0)), sexp_sint_value(arg1));
  if (err) {
  res = SEXP_FALSE;
  } else {
  res = SEXP_TRUE;
  }
  return res;
}